

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.cxx
# Opt level: O1

bool cmUnsetCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  string *name;
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  long local_28 [2];
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == name || 0x40 < (ulong)((long)psVar1 - (long)name)) {
    local_38._M_len = (size_t)local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002e98ed:
    if ((long *)local_38._M_len != local_28) {
      operator_delete((void *)local_38._M_len,local_28[0] + 1);
    }
    bVar3 = false;
  }
  else {
    local_38._M_str = (name->_M_dataplus)._M_p;
    local_38._M_len = name->_M_string_length;
    __str._M_str = "ENV{";
    __str._M_len = 4;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_38,0,4,__str);
    if ((iVar4 == 0) && (5 < name->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)name);
      cmSystemTools::UnsetEnv((char *)local_38._M_len);
      if ((long *)local_38._M_len != local_28) {
        operator_delete((void *)local_38._M_len,local_28[0] + 1);
      }
    }
    else {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
      if (lVar5 == 2) {
        iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 1));
        if (iVar4 != 0) goto LAB_002e989b;
        cmMakefile::RemoveCacheDefinition(status->Makefile,name);
      }
      else {
        if (lVar5 != 1) {
LAB_002e989b:
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x40) {
            iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 1));
            if (iVar4 == 0) {
              cmMakefile::RaiseScope(status->Makefile,name,(char *)0x0);
              goto LAB_002e9921;
            }
          }
          local_38._M_len = (size_t)local_28;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,"called with an invalid second argument","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002e98ed;
        }
        cmMakefile::RemoveDefinition(status->Makefile,name);
      }
    }
LAB_002e9921:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool cmUnsetCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (args.empty() || args.size() > 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto const& variable = args[0];

  // unset(ENV{VAR})
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& envVarName = variable.substr(4, variable.size() - 5);

#ifndef CMAKE_BOOTSTRAP
    cmSystemTools::UnsetEnv(envVarName.c_str());
#endif
    return true;
  }
  // unset(VAR)
  if (args.size() == 1) {
    status.GetMakefile().RemoveDefinition(variable);
    return true;
  }
  // unset(VAR CACHE)
  if ((args.size() == 2) && (args[1] == "CACHE")) {
    status.GetMakefile().RemoveCacheDefinition(variable);
    return true;
  }
  // unset(VAR PARENT_SCOPE)
  if ((args.size() == 2) && (args[1] == "PARENT_SCOPE")) {
    status.GetMakefile().RaiseScope(variable, nullptr);
    return true;
  }
  // ERROR: second argument isn't CACHE or PARENT_SCOPE
  status.SetError("called with an invalid second argument");
  return false;
}